

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall DataRefs::FetchPAc(DataRefs *this)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  LTAircraft *pLVar4;
  long in_RDI;
  const_iterator fdIter;
  FDKeyTy fdKey;
  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
  *in_stack_ffffffffffffff28;
  iterator local_b0;
  _Rb_tree_const_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> local_a8;
  iterator local_a0;
  _Rb_tree_const_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>
  in_stack_ffffffffffffff68;
  string local_80 [12];
  int in_stack_ffffffffffffff8c;
  string *in_stack_ffffffffffffff90;
  FDKeyType in_stack_ffffffffffffff9c;
  FDKeyTy *in_stack_ffffffffffffffa0;
  string local_30 [47];
  bool local_1;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    GetDebugAcFilter_abi_cxx11_((DataRefs *)in_stack_ffffffffffffff68._M_node);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x940),local_30);
    std::__cxx11::string::~string(local_30);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(local_80,(string *)(in_RDI + 0x940));
    LTFlightData::FDKeyTy::FDKeyTy
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c);
    std::__cxx11::string::~string(local_80);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
         ::find(in_stack_ffffffffffffff28,(key_type *)0x13ca6b);
    std::_Rb_tree_const_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::
    _Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> *)
               &stack0xffffffffffffff68,&local_a0);
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
         ::end(in_stack_ffffffffffffff28);
    std::_Rb_tree_const_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::
    _Rb_tree_const_iterator(&local_a8,&local_b0);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff68,&local_a8);
    if (bVar1) {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>
                           *)0x13caca);
      pLVar4 = LTFlightData::GetAircraft(&ppVar3->second);
      *(LTAircraft **)(in_RDI + 0x960) = pLVar4;
      local_1 = *(long *)(in_RDI + 0x960) != 0;
    }
    else {
      *(undefined8 *)(in_RDI + 0x960) = 0;
      std::__cxx11::string::clear();
      local_1 = false;
    }
    LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x13cb74);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DataRefs::FetchPAc ()
{
    // if there is no a/c defined yet, BUT there is a debug a/c defined
    // then we use that debug a/c
    if ( keyAc.empty() )
        keyAc = GetDebugAcFilter();
    
    // short-cut if there is still no key
    if ( keyAc.empty() )
        return false;
    
    // find that key's element
    LTFlightData::FDKeyTy fdKey (LTFlightData::KEY_ICAO, keyAc);
    mapLTFlightDataTy::const_iterator fdIter = mapFd.find(fdKey);
    if (fdIter != mapFd.end()) {
        // found, save ptr to a/c
        pAc = fdIter->second.GetAircraft();
        // that pointer might be NULL if a/c has not yet been created!
        return pAc != nullptr;
    }

    // not found, clear all ptr/keys
    pAc = nullptr;
    keyAc.clear();
    return false;
}